

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

int memcmp(void *__s1,void *__s2,size_t __n)

{
  byte *pbVar1;
  byte *pbVar2;
  int iVar3;
  size_t i;
  
  i = 0;
  do {
    if (__n == i) {
      return 0;
    }
    pbVar1 = (byte *)((long)__s1 + i);
    pbVar2 = (byte *)((long)__s2 + i);
    i = i + 1;
    iVar3 = (uint)*pbVar1 - (uint)*pbVar2;
  } while (iVar3 == 0);
  return iVar3;
}

Assistant:

int memcmp(const void *lhs, const void *rhs, size_t count) {
    const unsigned char *lhs_ = lhs;
    const unsigned char *rhs_ = rhs;

    for (size_t i = 0; i < count; ++i) {
        const int res = lhs_[i] - rhs_[i];
        if (res != 0) {
            return res;
        }
    }

    return 0;
}